

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O1

adios2_error adios2_store_stats_only(adios2_variable *variable,adios2_bool mode)

{
  adios2::core::VariableBase::StoreStatsOnly(SUB81(variable,0));
  return adios2_error_none;
}

Assistant:

adios2_error adios2_store_stats_only(adios2_variable *variable, const adios2_bool mode)
{
    try
    {
        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);
        variableBase->StoreStatsOnly(mode);

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_set_memory_space"));
    }
}